

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

Vec_Ptr_t * Abc_CutFactor(Abc_Obj_t *pNode)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *vLeaves;
  void **ppvVar4;
  long lVar5;
  
  uVar3 = *(uint *)&pNode->field_0x14 & 0xf;
  if ((uVar3 != 5) && (uVar3 != 2)) {
    vLeaves = (Vec_Ptr_t *)malloc(0x10);
    vLeaves->nCap = 10;
    vLeaves->nSize = 0;
    ppvVar4 = (void **)malloc(0x50);
    vLeaves->pArray = ppvVar4;
    Abc_CutFactor_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vLeaves);
    Abc_CutFactor_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vLeaves);
    iVar2 = vLeaves->nSize;
    if (0 < (long)iVar2) {
      ppvVar4 = vLeaves->pArray;
      lVar5 = 0;
      do {
        puVar1 = (uint *)((long)ppvVar4[lVar5] + 0x14);
        *puVar1 = *puVar1 & 0xffffffef;
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
    return vLeaves;
  }
  __assert_fail("!Abc_ObjIsCi(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                ,0x819,"Vec_Ptr_t *Abc_CutFactor(Abc_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Abc_CutFactor( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vLeaves;
    Abc_Obj_t * pObj;
    int i;
    assert( !Abc_ObjIsCi(pNode) );
    vLeaves  = Vec_PtrAlloc( 10 );
    Abc_CutFactor_rec( Abc_ObjFanin0(pNode), vLeaves );
    Abc_CutFactor_rec( Abc_ObjFanin1(pNode), vLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkA = 0;
    return vLeaves;
}